

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

CURLcode curlx_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  byte *pbVar1;
  long lVar2;
  size_t sVar3;
  uchar *__ptr;
  uchar *puVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  size_t padc;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  uchar lookup [256];
  byte local_138 [43];
  undefined1 local_10d [221];
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar3 = strlen(src);
  if ((sVar3 & 3) != 0 || sVar3 == 0) {
    return CURLE_BAD_CONTENT_ENCODING;
  }
  lVar12 = 0;
  while (src[lVar12 + (sVar3 - 1)] == '=') {
    lVar12 = lVar12 + -1;
    if (lVar12 == -3) {
      return CURLE_BAD_CONTENT_ENCODING;
    }
  }
  lVar2 = (sVar3 >> 2) * 3;
  lVar11 = ((sVar3 >> 2) - 1) + (ulong)(lVar12 == 0);
  __ptr = (uchar *)malloc(lVar12 + lVar2 + 1);
  if (__ptr == (uchar *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  memset(local_138,0xff,0x100);
  memcpy(local_10d,decodetable,0x50);
  puVar4 = __ptr;
  if (lVar11 != 0) {
    lVar5 = 0;
    do {
      pbVar1 = (byte *)src + 4;
      iVar7 = 4;
      uVar8 = 0;
      pbVar10 = (byte *)src;
      do {
        src = (char *)(pbVar10 + 1);
        if (local_138[*pbVar10] == 0xff) {
          iVar7 = 10;
          goto LAB_00120e24;
        }
        uVar6 = uVar8 << 6;
        uVar8 = local_138[*pbVar10] | uVar6;
        iVar7 = iVar7 + -1;
        pbVar10 = (byte *)src;
      } while (iVar7 != 0);
      puVar4[2] = (uchar)uVar8;
      puVar4[1] = (uchar)(uVar6 >> 8);
      *puVar4 = (uchar)(uVar6 >> 0x10);
      puVar4 = puVar4 + 3;
      iVar7 = 0;
      src = (char *)pbVar1;
LAB_00120e24:
      if (iVar7 != 0) {
        if (iVar7 != 10) {
          return CURLE_BAD_CONTENT_ENCODING;
        }
        goto LAB_00120ed7;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar11);
  }
  if (lVar12 != 0) {
    lVar11 = 0;
    uVar9 = 0;
    uVar8 = 0;
    do {
      if ((ulong)((byte *)src)[lVar11] == 0x3d) {
        uVar9 = uVar9 + 1;
        if ((ulong)-lVar12 < uVar9) {
LAB_00120eb0:
          iVar7 = 10;
          goto LAB_00120eb5;
        }
        uVar8 = uVar8 << 6;
      }
      else {
        if (local_138[((byte *)src)[lVar11]] == 0xff) goto LAB_00120eb0;
        uVar8 = uVar8 << 6 | (uint)local_138[((byte *)src)[lVar11]];
      }
      lVar11 = lVar11 + 1;
    } while ((int)lVar11 != 4);
    if (lVar12 == -1) {
      puVar4[1] = (uchar)(uVar8 >> 8);
    }
    *puVar4 = (uchar)(uVar8 >> 0x10);
    puVar4 = puVar4 + lVar12 + 3;
    iVar7 = 0;
LAB_00120eb5:
    if (iVar7 == 10) {
LAB_00120ed7:
      free(__ptr);
      return CURLE_BAD_CONTENT_ENCODING;
    }
    if (iVar7 != 0) {
      return CURLE_BAD_CONTENT_ENCODING;
    }
  }
  *puVar4 = '\0';
  *outptr = __ptr;
  *outlen = lVar2 + lVar12;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t fullQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;
  unsigned char lookup[256];

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* srclen is at least 4 here */
  while(src[srclen - 1 - padding] == '=') {
    /* count padding characters */
    padding++;
    /* A maximum of two = padding characters is allowed */
    if(padding > 2)
      return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;
  fullQuantums = numQuantums - (padding ? 1 : 0);

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a null-terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  memset(lookup, 0xff, sizeof(lookup));
  memcpy(&lookup['+'], decodetable, sizeof(decodetable));
  /* replaces
  {
    unsigned char c;
    const unsigned char *p = (const unsigned char *)base64encdec;
    for(c = 0; *p; c++, p++)
      lookup[*p] = c;
  }
  */

  /* Decode the complete quantums first */
  for(i = 0; i < fullQuantums; i++) {
    unsigned char val;
    unsigned int x = 0;
    int j;

    for(j = 0; j < 4; j++) {
      val = lookup[(unsigned char)*src++];
      if(val == 0xff) /* bad symbol */
        goto bad;
      x = (x << 6) | val;
    }
    pos[2] = x & 0xff;
    pos[1] = (x >> 8) & 0xff;
    pos[0] = (x >> 16) & 0xff;
    pos += 3;
  }
  if(padding) {
    /* this means either 8 or 16 bits output */
    unsigned char val;
    unsigned int x = 0;
    int j;
    size_t padc = 0;
    for(j = 0; j < 4; j++) {
      if(*src == '=') {
        x <<= 6;
        src++;
        if(++padc > padding)
          /* this is a badly placed '=' symbol! */
          goto bad;
      }
      else {
        val = lookup[(unsigned char)*src++];
        if(val == 0xff) /* bad symbol */
          goto bad;
        x = (x << 6) | val;
      }
    }
    if(padding == 1)
      pos[1] = (x >> 8) & 0xff;
    pos[0] = (x >> 16) & 0xff;
    pos += 3 - padding;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
bad:
  free(newstr);
  return CURLE_BAD_CONTENT_ENCODING;
}